

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O3

double __thiscall chrono::ChDirectSolverLS::SolveCurrent(ChDirectSolverLS *this)

{
  ChVectorDynamic<double> *this_00;
  undefined1 auVar1 [16];
  uint uVar2;
  rep_conflict rVar3;
  long lVar4;
  ChLog *pCVar5;
  ChStreamOutAscii *pCVar6;
  undefined1 auVar7 [64];
  ChVectorDynamic<double> *local_38;
  ChSparseMatrix *local_30;
  ChVectorDynamic<double> *local_28;
  undefined1 extraout_var [56];
  
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->m_timer_solve_assembly).m_start.__d.__r = rVar3;
  this_00 = &this->m_sol;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (this->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows);
  lVar4 = std::chrono::_V2::system_clock::now();
  (this->m_timer_solve_assembly).m_end.__d.__r = lVar4;
  (this->m_timer_solve_assembly).m_total.__r =
       (double)(lVar4 - (this->m_timer_solve_assembly).m_start.__d.__r) / 1000000000.0 +
       (this->m_timer_solve_assembly).m_total.__r;
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->m_timer_solve_solvercall).m_start.__d.__r = rVar3;
  uVar2 = (*(this->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xd])(this);
  lVar4 = std::chrono::_V2::system_clock::now();
  (this->m_timer_solve_solvercall).m_end.__d.__r = lVar4;
  (this->m_timer_solve_solvercall).m_total.__r =
       (double)(lVar4 - (this->m_timer_solve_solvercall).m_start.__d.__r) / 1000000000.0 +
       (this->m_timer_solve_solvercall).m_total.__r;
  if ((this->super_ChSolverLS).super_ChSolver.verbose == true) {
    if ((this->m_mat).m_innerSize !=
        (this->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows) {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                    "Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::SparseMatrix<double, 1>, _Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                   );
    }
    local_38 = &this->m_rhs;
    local_30 = &this->m_mat;
    local_28 = this_00;
    if ((this->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != (this->m_mat).m_outerSize) {
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>]"
                   );
    }
    auVar7._0_8_ = Eigen::
                   MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>_>_>
                   ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                                  *)&local_38);
    auVar7._8_56_ = extraout_var;
    auVar1 = vsqrtsd_avx(auVar7._0_16_,auVar7._0_16_);
    pCVar5 = GetLog();
    pCVar6 = ChStreamOutAscii::operator<<
                       (&pCVar5->super_ChStreamOutAscii," Solver SolveCurrent() [");
    pCVar6 = ChStreamOutAscii::operator<<(pCVar6,this->m_solve_call);
    pCVar6 = ChStreamOutAscii::operator<<(pCVar6,"]  |residual| = ");
    pCVar6 = ChStreamOutAscii::operator<<(pCVar6,auVar1._0_8_);
    ChStreamOutAscii::operator<<(pCVar6,"\n\n");
    pCVar5 = GetLog();
    pCVar6 = ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,"  assembly rhs+sol:  ");
    lVar4 = std::chrono::_V2::system_clock::now();
    pCVar6 = ChStreamOutAscii::operator<<
                       (pCVar6,(double)(lVar4 - (this->m_timer_solve_assembly).m_start.__d.__r) /
                               1000000000.0);
    pCVar6 = ChStreamOutAscii::operator<<(pCVar6,"s\n");
    pCVar6 = ChStreamOutAscii::operator<<(pCVar6,"  solve:             ");
    lVar4 = std::chrono::_V2::system_clock::now();
    pCVar6 = ChStreamOutAscii::operator<<
                       (pCVar6,(double)(lVar4 - (this->m_timer_solve_solvercall).m_start.__d.__r) /
                               1000000000.0);
    ChStreamOutAscii::operator<<(pCVar6,"\n");
  }
  if ((char)uVar2 == '\0') {
    pCVar5 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,"Solver SolveCurrent() failed\n");
    (*(this->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xe])(this);
  }
  return (double)(uVar2 & 0xff);
}

Assistant:

double ChDirectSolverLS::SolveCurrent() {
    m_timer_solve_assembly.start();
    m_sol.resize(m_rhs.size());
    m_timer_solve_assembly.stop();

    // Let the concrete solver compute the solution
    m_timer_solve_solvercall.start();
    bool result = SolveSystem();
    m_timer_solve_solvercall.stop();

    if (verbose) {
        double res_norm = (m_rhs - m_mat * m_sol).norm();
        GetLog() << " Solver SolveCurrent() [" << m_solve_call << "]  |residual| = " << res_norm << "\n\n";
        GetLog() << "  assembly rhs+sol:  " << m_timer_solve_assembly.GetTimeSecondsIntermediate() << "s\n"
                 << "  solve:             " << m_timer_solve_solvercall.GetTimeSecondsIntermediate() << "\n";
    }

    if (!result) {
        // If the solution failed, let the concrete solver display an error message.
        GetLog() << "Solver SolveCurrent() failed\n";
        PrintErrorMessage();
    }

    return result;
}